

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O2

void sort(void *b_,ReduceProxy *srp,SortPartners *partners)

{
  uint uVar1;
  pointer ppVar2;
  Histogram histogram;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  uVar1 = srp->round_;
  ppVar2 = (partners->rounds_).
           super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(partners->rounds_).
            super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl
            .super__Vector_impl_data._M_finish - (long)ppVar2 >> 3 == (ulong)uVar1) {
    dequeue_exchange(b_,srp);
    sort_local(b_,srp);
    return;
  }
  if (ppVar2[(int)uVar1].first == true) {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    receive_histogram(b_,srp,(Histogram *)&local_28);
    enqueue_exchange(b_,srp,(Histogram *)&local_28);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
    return;
  }
  if (ppVar2[(int)uVar1].second != 0) {
    add_histogram(b_,srp);
    return;
  }
  if (uVar1 != 0) {
    dequeue_exchange(b_,srp);
  }
  compute_local_histogram(b_,srp);
  return;
}

Assistant:

void sort(void* b_, const diy::ReduceProxy& srp, const SortPartners& partners)
{
    if (srp.round() == partners.rounds())
    {
        dequeue_exchange(b_, srp);
        sort_local(b_, srp);
    }
    else if (partners.exchange_round(srp.round()))
    {
        Histogram histogram;
        receive_histogram(b_, srp, histogram);
        enqueue_exchange(b_, srp, histogram);
    } else if (partners.sub_round(srp.round()) == 0)
    {
        if (srp.round() > 0)
            dequeue_exchange(b_, srp);

        compute_local_histogram(b_, srp);
    } else
        add_histogram(b_, srp);
}